

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

affine3f * pbrt::math::affine3f::rotate(vec3f *_u,float r)

{
  affine3f *in_RDI;
  float in_XMM0_Da;
  vec3f vVar1;
  mat3f l;
  float c;
  float s;
  vec3f u;
  mat3f *in_stack_ffffffffffffff78;
  affine3f *in_stack_ffffffffffffff80;
  vec3f *in_stack_ffffffffffffff90;
  vec3f local_60;
  mat3f local_54;
  float local_30;
  float local_2c;
  vec3f local_28;
  undefined8 local_18;
  float local_10;
  float local_c;
  
  local_c = in_XMM0_Da;
  vVar1 = normalize(in_stack_ffffffffffffff90);
  local_28._0_8_ = vVar1._0_8_;
  local_18._0_4_ = local_28.x;
  local_18._4_4_ = local_28.y;
  local_28.z = vVar1.z;
  local_10 = local_28.z;
  local_28 = vVar1;
  local_2c = sinf(local_c);
  local_30 = cosf(local_c);
  vec3f::vec3f(&local_60,
               (float)local_18 * (float)local_18 +
               (-(float)local_18 * (float)local_18 + 1.0) * local_30,
               (float)local_18 * local_18._4_4_ * (1.0 - local_30) + local_10 * local_2c,
               (float)local_18 * local_10 * (1.0 - local_30) + -(local_18._4_4_ * local_2c));
  vec3f::vec3f((vec3f *)&stack0xffffffffffffff94,
               (float)local_18 * local_18._4_4_ * (1.0 - local_30) + -(local_10 * local_2c),
               local_18._4_4_ * local_18._4_4_ + (-local_18._4_4_ * local_18._4_4_ + 1.0) * local_30
               ,local_18._4_4_ * local_10 * (1.0 - local_30) + (float)local_18 * local_2c);
  vec3f::vec3f((vec3f *)&stack0xffffffffffffff88,
               (float)local_18 * local_10 * (1.0 - local_30) + local_18._4_4_ * local_2c,
               local_18._4_4_ * local_10 * (1.0 - local_30) + -((float)local_18 * local_2c),
               local_10 * local_10 + (-local_10 * local_10 + 1.0) * local_30);
  mat3f::mat3f(&local_54,&local_60,(vec3f *)&stack0xffffffffffffff94,
               (vec3f *)&stack0xffffffffffffff88);
  vec3f::vec3f((vec3f *)&stack0xffffffffffffff7c,0.0);
  affine3f(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(vec3f *)in_RDI);
  return in_RDI;
}

Assistant:

inline affine3f affine3f::rotate(const vec3f& _u, float r) {
      vec3f u = normalize(_u);
      float s = sinf(r), c = cosf(r);
      mat3f l = mat3f(vec3f(u.x*u.x+(1-u.x*u.x)*c, u.x*u.y*(1-c)+u.z*s, u.x*u.z*(1-c)-u.y*s),
                      vec3f(u.x*u.y*(1-c)-u.z*s, u.y*u.y+(1-u.y*u.y)*c, u.y*u.z*(1-c)+u.x*s),   
                      vec3f(u.x*u.z*(1-c)+u.y*s, u.y*u.z*(1-c)-u.x*s, u.z*u.z+(1-u.z*u.z)*c));
      return affine3f(l, vec3f(0));
    }